

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Csv.cpp
# Opt level: O0

int __thiscall CASC_CSV::GetData(CASC_CSV *this,QUERY_KEY *Key,size_t Index,bool bHexaValue)

{
  size_t __n;
  LPBYTE pBVar1;
  size_t nLength;
  bool bHexaValue_local;
  size_t Index_local;
  QUERY_KEY *Key_local;
  CASC_CSV *this_local;
  
  if (Index < this->nColumns) {
    if (bHexaValue) {
      pBVar1 = (LPBYTE)malloc(this->Columns[Index].nLength >> 1);
      Key->pbData = pBVar1;
      if (Key->pbData == (LPBYTE)0x0) {
        this_local._4_4_ = 0xc;
      }
      else {
        Key->cbData = this->Columns[Index].nLength >> 1;
        this_local._4_4_ =
             ConvertStringToBinary
                       (this->Columns[Index].szString,this->Columns[Index].nLength,Key->pbData);
      }
    }
    else {
      __n = this->Columns[Index].nLength;
      pBVar1 = (LPBYTE)malloc(__n + 1);
      Key->pbData = pBVar1;
      if (Key->pbData == (LPBYTE)0x0) {
        this_local._4_4_ = 0xc;
      }
      else {
        memcpy(Key->pbData,this->Columns[Index].szString,__n);
        Key->pbData[__n] = '\0';
        Key->cbData = __n;
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    this_local._4_4_ = 0x69;
  }
  return this_local._4_4_;
}

Assistant:

int CASC_CSV::GetData(QUERY_KEY & Key, size_t Index, bool bHexaValue)
{
    // Check for index overflow
    if (Index >= nColumns)
        return ERROR_INSUFFICIENT_BUFFER;

    // Allocate space for the blob
    if (bHexaValue)
    {
        // Allocate space
        Key.pbData = CASC_ALLOC(BYTE, Columns[Index].nLength / 2);
        if (Key.pbData == NULL)
            return ERROR_NOT_ENOUGH_MEMORY;

        // Convert the hexa string to binary string
        Key.cbData = Columns[Index].nLength / 2;
        return ConvertStringToBinary(Columns[Index].szString, Columns[Index].nLength, Key.pbData);
    }
    else
    {
        size_t nLength = Columns[Index].nLength;

        // Initialize the blob
        Key.pbData = CASC_ALLOC(BYTE, nLength + 1);
        if (Key.pbData == NULL)
            return ERROR_NOT_ENOUGH_MEMORY;

        // Copy the string
        memcpy(Key.pbData, Columns[Index].szString, nLength);
        Key.pbData[nLength] = 0;
        Key.cbData = nLength;
        return ERROR_SUCCESS;
    }
}